

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

void __thiscall DEnterKey::SetMenuMessage(DEnterKey *this,int which)

{
  bool bVar1;
  DMenu *this_00;
  DOptionMenu *this_01;
  FName local_2c;
  FOptionMenuItem *local_28;
  FListMenuItem *it;
  DOptionMenu *m;
  DEnterKey *pDStack_10;
  int which_local;
  DEnterKey *this_local;
  
  m._4_4_ = which;
  pDStack_10 = this;
  this_00 = TObjPtr<DMenu>::operator->(&(this->super_DMenu).mParentMenu);
  bVar1 = DObject::IsKindOf(&this_00->super_DObject,DOptionMenu::RegistrationInfo.MyClass);
  if (bVar1) {
    this_01 = barrier_cast<DOptionMenu*,DMenu>(&(this->super_DMenu).mParentMenu);
    it = (FListMenuItem *)this_01;
    FName::FName(&local_2c,NAME_Controlmessage);
    local_28 = DOptionMenu::GetItem(this_01,&local_2c);
    if (local_28 != (FOptionMenuItem *)0x0) {
      (*(local_28->super_FListMenuItem)._vptr_FListMenuItem[10])(local_28,0,(ulong)m._4_4_);
    }
  }
  return;
}

Assistant:

void SetMenuMessage(int which)
	{
		if (mParentMenu->IsKindOf(RUNTIME_CLASS(DOptionMenu)))
		{
			DOptionMenu *m = barrier_cast<DOptionMenu*>(mParentMenu);
			FListMenuItem *it = m->GetItem(NAME_Controlmessage);
			if (it != NULL)
			{
				it->SetValue(0, which);
			}
		}
	}